

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

cf_bool_t cf_str_center(cf_char_t *dst,cf_size_t size,cf_char_t *s,cf_char_t c,cf_size_t total)

{
  size_t sVar1;
  char *local_50;
  cf_char_t *p;
  cf_size_t len;
  cf_size_t left;
  cf_size_t total_local;
  cf_char_t *pcStack_28;
  cf_char_t c_local;
  cf_char_t *s_local;
  cf_size_t size_local;
  cf_char_t *dst_local;
  
  if ((dst == (cf_char_t *)0x0) || (s == (cf_char_t *)0x0)) {
    dst_local._4_4_ = 0;
  }
  else {
    sVar1 = strlen(s);
    if ((size < sVar1 + 1) || (size < total + 1)) {
      dst_local._4_4_ = 0;
    }
    else {
      for (local_50 = dst; pcStack_28 = s, local_50 < dst + (total - sVar1 >> 1);
          local_50 = local_50 + 1) {
        *local_50 = c;
      }
      for (; *pcStack_28 != '\0'; pcStack_28 = pcStack_28 + 1) {
        *local_50 = *pcStack_28;
        local_50 = local_50 + 1;
      }
      for (; local_50 < dst + total; local_50 = local_50 + 1) {
        *local_50 = c;
      }
      dst[total] = '\0';
      dst_local._4_4_ = 1;
    }
  }
  return dst_local._4_4_;
}

Assistant:

cf_bool_t cf_str_center(cf_char_t* dst, cf_size_t size, cf_char_t* s, cf_char_t c, cf_size_t total) {
    cf_size_t left = 0, len = 0;
    cf_char_t* p = CF_NULL_PTR;
    if (!dst || !s) {
        return CF_FALSE;
    }
    // no enough space to hold 
    len = strlen(s);
    if (len + 1 > size || total + 1 > size) {
        return CF_FALSE;
    }

    left = (total - len) / 2;
    p = dst;
    // fill left
    while (p < dst + left) {
        *p = c;
        p++;
    }
    // copy string
    while (*s != '\0') {
        *p = *s;
        s++;
        p++;
    }
    // fill right
    while (p < dst + total) {
        *p = c;
        p++;
    }
    dst[total] = '\0';
    
    return CF_TRUE;
}